

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::InputFile::compatibilityInitialize(InputFile *this,IStream *is)

{
  InputFile *this_00;
  long *in_RSI;
  InputPartData *in_RDI;
  InputPartData *part;
  bool in_stack_000001b3;
  int in_stack_000001b4;
  IStream *in_stack_000001b8;
  MultiPartInputFile *in_stack_000001c0;
  
  (**(code **)(*in_RSI + 0x30))(in_RSI,0);
  *(undefined1 *)
   (*(long *)&(in_RDI->header)._map._M_t._M_impl.super__Rb_tree_header._M_header + 0xe8) = 1;
  this_00 = (InputFile *)operator_new(0x10);
  MultiPartInputFile::MultiPartInputFile
            (in_stack_000001c0,in_stack_000001b8,in_stack_000001b4,in_stack_000001b3);
  *(InputFile **)
   (*(long *)&(in_RDI->header)._map._M_t._M_impl.super__Rb_tree_header._M_header + 0xf0) = this_00;
  MultiPartInputFile::getPart((MultiPartInputFile *)this_00,(int)((ulong)in_RDI >> 0x20));
  multiPartInitialize(this_00,in_RDI);
  return;
}

Assistant:

void
InputFile::compatibilityInitialize (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is)
{
    is.seekg(0);

    //
    // Construct a MultiPartInputFile, initialize InputFile
    // with the part 0 data.
    // (TODO) may want to have a way to set the reconstruction flag.
    //
    _data->multiPartBackwardSupport = true;
    _data->multiPartFile = new MultiPartInputFile(is, _data->numThreads);
    InputPartData* part = _data->multiPartFile->getPart(0);

    multiPartInitialize (part);
}